

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Block::Parse(Block *this,Cluster *pCluster)

{
  IMkvReader *pReader;
  byte bVar1;
  bool bVar2;
  longlong *plVar3;
  int iVar4;
  int iVar5;
  longlong lVar6;
  long lVar7;
  Frame *pFVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  byte bVar12;
  Frame *curr;
  long lVar13;
  Frame *pFVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uchar val;
  uchar biased_count;
  Frame *f;
  long len;
  longlong value;
  long local_78;
  byte local_62;
  byte local_61;
  Frame *local_60;
  Frame *local_58;
  long local_50;
  IMkvReader *local_48;
  long local_40;
  long local_38;
  
  if (pCluster == (Cluster *)0x0) {
    return -1;
  }
  if (pCluster->m_pSegment == (Segment *)0x0) {
    return -1;
  }
  lVar15 = this->m_start;
  if (lVar15 < 0) {
    __assert_fail("m_start >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1dec,"long mkvparser::Block::Parse(const Cluster *)");
  }
  lVar13 = this->m_size;
  if (lVar13 < 0) {
    __assert_fail("m_size >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1ded,"long mkvparser::Block::Parse(const Cluster *)");
  }
  if (0 < this->m_track) {
    __assert_fail("m_track <= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1dee,"long mkvparser::Block::Parse(const Cluster *)");
  }
  if (this->m_frames != (Frame *)0x0) {
    __assert_fail("m_frames == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1def,"long mkvparser::Block::Parse(const Cluster *)");
  }
  if (0 < this->m_frame_count) {
    __assert_fail("m_frame_count <= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1df0,"long mkvparser::Block::Parse(const Cluster *)");
  }
  pReader = pCluster->m_pSegment->m_pReader;
  lVar6 = ReadUInt(pReader,lVar15,&local_50);
  local_60 = (Frame *)local_50;
  this->m_track = lVar6;
  if (lVar6 < 1) {
    return -2;
  }
  if (lVar13 - local_50 < 2 || lVar13 < local_50) {
    return -2;
  }
  local_78 = lVar15 + local_50;
  lVar7 = UnserializeInt(pReader,local_78,2,&local_38);
  if (lVar7 != 0) {
    return -2;
  }
  if ((short)local_38 != local_38) {
    return -2;
  }
  lVar15 = lVar15 + lVar13;
  this->m_timecode = (short)local_38;
  if (lVar15 <= local_78 + 2) {
    return -2;
  }
  local_48 = pReader;
  iVar4 = (**pReader->_vptr_IMkvReader)(pReader,local_78 + 2,1,&this->m_flags);
  if (iVar4 != 0) {
    return -2;
  }
  bVar1 = this->m_flags >> 1;
  lVar7 = local_78 + 3;
  bVar12 = bVar1 & 3;
  if ((bVar1 & 3) == 0) {
    if (lVar15 < lVar7) {
      return -2;
    }
    this->m_frame_count = 1;
    pFVar8 = (Frame *)operator_new__(0x10,(nothrow_t *)&std::nothrow);
    this->m_frames = pFVar8;
    if (pFVar8 != (Frame *)0x0) {
      pFVar8->pos = lVar7;
      if (lVar15 - lVar7 == 0 || lVar15 < lVar7) {
        return -2;
      }
      pFVar8->len = lVar15 - lVar7;
      return 0;
    }
  }
  else {
    if (lVar15 <= lVar7) {
      return -2;
    }
    iVar4 = (**pReader->_vptr_IMkvReader)(pReader,lVar7,1,&local_61);
    if (iVar4 != 0) {
      return -2;
    }
    local_78 = local_78 + 4;
    if (lVar15 < local_78) {
      return -2;
    }
    uVar11 = (uint)local_61;
    uVar16 = local_61 + 1;
    this->m_frame_count = uVar16;
    local_58 = (Frame *)(ulong)(uVar16 * 0x10);
    pFVar8 = (Frame *)operator_new__((ulong)local_58,(nothrow_t *)&std::nothrow);
    this->m_frames = pFVar8;
    if (pFVar8 != (Frame *)0x0) {
      if (bVar12 == 2) {
        lVar7 = lVar15 - local_78;
        if (lVar7 == 0 || lVar15 < local_78) {
          return -2;
        }
        lVar9 = lVar7 / (long)(ulong)uVar16;
        if (lVar7 % (long)(ulong)uVar16 != 0) {
          return -2;
        }
        if (lVar9 < 1) {
          return -2;
        }
        plVar3 = &pFVar8->pos;
        lVar13 = ((long)local_60 - lVar13) + 4;
        do {
          if (lVar15 < local_78 + lVar9) {
            __assert_fail("(pos + frame_size) <= stop",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1eb8,"long mkvparser::Block::Parse(const Cluster *)");
          }
          pFVar8->pos = local_78;
          pFVar8->len = lVar9;
          pFVar8 = pFVar8 + 1;
          lVar13 = lVar13 + lVar9;
          local_78 = local_78 + lVar9;
        } while (pFVar8 != (Frame *)((long)plVar3 + (ulong)(uVar16 * 0x10)));
        if (lVar13 != 0) {
          __assert_fail("pos == stop",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1ec4,"long mkvparser::Block::Parse(const Cluster *)");
        }
        return 0;
      }
      if (bVar12 == 1) {
        local_58 = (Frame *)((long)&pFVar8->pos + (long)local_58);
        local_40 = 0;
        local_60 = pFVar8;
        while (1 < (int)uVar16) {
          lVar13 = 0;
          do {
            iVar4 = 1;
            if ((local_78 < lVar15) &&
               (iVar5 = (**pReader->_vptr_IMkvReader)(pReader,local_78,1), iVar5 == 0)) {
              local_78 = local_78 + 1;
              lVar13 = lVar13 + (ulong)local_62;
              iVar4 = (uint)((ulong)local_62 != 0xff) << 2;
            }
          } while (iVar4 == 0);
          if (iVar4 == 4) {
            pFVar8 = local_60 + 1;
            if (local_58 <= pFVar8) {
              __assert_fail("pf < pf_end",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x1e6f,"long mkvparser::Block::Parse(const Cluster *)");
            }
            local_60->pos = 0;
            if (lVar13 < 1) {
              bVar2 = false;
              local_60 = pFVar8;
            }
            else {
              local_60->len = lVar13;
              local_40 = local_40 + lVar13;
              uVar16 = uVar16 - 1;
              bVar2 = true;
              local_60 = pFVar8;
            }
          }
          else {
            bVar2 = false;
          }
          if (!bVar2) {
            return -2;
          }
        }
        lVar13 = lVar15 - local_78;
        if (local_60 + 1 != local_58 || (lVar15 < local_78 || local_58 <= local_60)) {
          return -2;
        }
        local_60->pos = 0;
        if (lVar13 < local_40) {
          return -2;
        }
        if (lVar13 - local_40 == 0 || lVar13 < local_40) {
          return -2;
        }
        local_60->len = lVar13 - local_40;
        for (pFVar8 = this->m_frames; pFVar8 != local_58; pFVar8 = pFVar8 + 1) {
          lVar13 = pFVar8->len + local_78;
          if (lVar15 < lVar13) {
            __assert_fail("(pos + f.len) <= stop",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1e99,"long mkvparser::Block::Parse(const Cluster *)");
          }
          pFVar8->pos = local_78;
          local_78 = lVar13;
        }
        if (local_78 != lVar15) {
          __assert_fail("pos == stop",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1ea2,"long mkvparser::Block::Parse(const Cluster *)");
        }
        return 0;
      }
      if (lVar15 <= local_78) {
        return -2;
      }
      uVar10 = ReadUInt(local_48,local_78,&local_50);
      if ((long)uVar10 < 1) {
        return -2;
      }
      local_78 = local_78 + local_50;
      if (lVar15 < (long)(local_78 + uVar10) || lVar15 < local_78) {
        return -2;
      }
      pFVar8 = this->m_frames;
      iVar4 = this->m_frame_count;
      local_60 = pFVar8 + iVar4;
      pFVar8->pos = 0;
      pFVar8->len = uVar10;
      lVar13 = (long)iVar4 * 0x10 + -0x20;
      uVar17 = uVar10;
      while( true ) {
        pFVar14 = pFVar8 + 1;
        if ((int)uVar11 < 2) {
          if (uVar11 == 1) {
            lVar7 = lVar15 - local_78;
            if (lVar15 < local_78) {
              return -2;
            }
            if (local_60 <= pFVar8) {
              return -2;
            }
            if (pFVar8->len != uVar10) {
              __assert_fail("prev.len == frame_size",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x1f30,"long mkvparser::Block::Parse(const Cluster *)");
            }
            if (local_60 <= pFVar14) {
              return -2;
            }
            if (lVar13 != 0) {
              return -2;
            }
            pFVar14->pos = 0;
            if (lVar7 < (long)uVar17) {
              return -2;
            }
            if (lVar7 - uVar17 == 0 || lVar7 < (long)uVar17) {
              return -2;
            }
            pFVar8[1].len = lVar7 - uVar17;
          }
          pFVar8 = this->m_frames;
          do {
            if (pFVar8 == local_60) {
              if (local_78 != lVar15) {
                return -2;
              }
              return 0;
            }
            lVar13 = pFVar8->len + local_78;
            if (lVar13 <= lVar15) {
              pFVar8->pos = local_78;
              local_78 = lVar13;
            }
            pFVar8 = pFVar8 + 1;
          } while (lVar13 <= lVar15);
          return -2;
        }
        if (lVar15 <= local_78) {
          return -2;
        }
        if (local_60 <= pFVar8) {
          __assert_fail("pf < pf_end",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1ef5,"long mkvparser::Block::Parse(const Cluster *)");
        }
        if (pFVar8->len != uVar10) {
          __assert_fail("prev.len == frame_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1efa,"long mkvparser::Block::Parse(const Cluster *)");
        }
        if (local_60 <= pFVar14) break;
        pFVar14->pos = 0;
        lVar6 = ReadUInt(local_48,local_78,&local_50);
        if ((lVar6 < 0) || (lVar7 = local_50 + local_78, lVar15 < lVar7)) {
          bVar2 = false;
        }
        else {
          uVar10 = uVar10 + lVar6 + (-1L << ((char)local_50 * '\a' - 1U & 0x3f)) + 1;
          local_78 = lVar7;
          if (((long)uVar10 < 1) ||
             (pFVar8[1].len = uVar10, (long)(uVar10 ^ 0x7fffffffffffffff) < (long)uVar17)) {
            bVar2 = false;
          }
          else {
            uVar17 = uVar17 + uVar10;
            uVar11 = uVar11 - 1;
            bVar2 = true;
          }
        }
        lVar13 = lVar13 + -0x10;
        pFVar8 = pFVar14;
        if (!bVar2) {
          return -2;
        }
      }
      __assert_fail("pf < pf_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1efe,"long mkvparser::Block::Parse(const Cluster *)");
    }
  }
  return -1;
}

Assistant:

long Block::Parse(const Cluster* pCluster) {
  if (pCluster == NULL)
    return -1;

  if (pCluster->m_pSegment == NULL)
    return -1;

  assert(m_start >= 0);
  assert(m_size >= 0);
  assert(m_track <= 0);
  assert(m_frames == NULL);
  assert(m_frame_count <= 0);

  long long pos = m_start;
  const long long stop = m_start + m_size;

  long len;

  IMkvReader* const pReader = pCluster->m_pSegment->m_pReader;

  m_track = ReadUInt(pReader, pos, len);

  if (m_track <= 0)
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > stop)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume track number

  if ((stop - pos) < 2)
    return E_FILE_FORMAT_INVALID;

  long status;
  long long value;

  status = UnserializeInt(pReader, pos, 2, value);

  if (status)
    return E_FILE_FORMAT_INVALID;

  if (value < SHRT_MIN)
    return E_FILE_FORMAT_INVALID;

  if (value > SHRT_MAX)
    return E_FILE_FORMAT_INVALID;

  m_timecode = static_cast<short>(value);

  pos += 2;

  if ((stop - pos) <= 0)
    return E_FILE_FORMAT_INVALID;

  status = pReader->Read(pos, 1, &m_flags);

  if (status)
    return E_FILE_FORMAT_INVALID;

  const int lacing = int(m_flags & 0x06) >> 1;

  ++pos;  // consume flags byte

  if (lacing == 0) {  // no lacing
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;

    m_frame_count = 1;
    m_frames = new (std::nothrow) Frame[m_frame_count];
    if (m_frames == NULL)
      return -1;

    Frame& f = m_frames[0];
    f.pos = pos;

    const long long frame_size = stop - pos;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    f.len = static_cast<long>(frame_size);

    return 0;  // success
  }

  if (pos >= stop)
    return E_FILE_FORMAT_INVALID;

  unsigned char biased_count;

  status = pReader->Read(pos, 1, &biased_count);

  if (status)
    return E_FILE_FORMAT_INVALID;

  ++pos;  // consume frame count
  if (pos > stop)
    return E_FILE_FORMAT_INVALID;

  m_frame_count = int(biased_count) + 1;

  m_frames = new (std::nothrow) Frame[m_frame_count];
  if (m_frames == NULL)
    return -1;

  if (!m_frames)
    return E_FILE_FORMAT_INVALID;

  if (lacing == 1) {  // Xiph
    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    long long size = 0;
    int frame_count = m_frame_count;

    while (frame_count > 1) {
      long frame_size = 0;

      for (;;) {
        unsigned char val;

        if (pos >= stop)
          return E_FILE_FORMAT_INVALID;

        status = pReader->Read(pos, 1, &val);

        if (status)
          return E_FILE_FORMAT_INVALID;

        ++pos;  // consume xiph size byte

        frame_size += val;

        if (val < 255)
          break;
      }

      Frame& f = *pf++;
      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = frame_size;
      size += frame_size;  // contribution of this frame

      --frame_count;
    }

    if (pf >= pf_end || pos > stop)
      return E_FILE_FORMAT_INVALID;

    {
      Frame& f = *pf++;

      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      const long long frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      assert((pos + f.len) <= stop);

      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else if (lacing == 2) {  // fixed-size lacing
    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    const long long total_size = stop - pos;

    if ((total_size % m_frame_count) != 0)
      return E_FILE_FORMAT_INVALID;

    const long long frame_size = total_size / m_frame_count;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    while (pf != pf_end) {
      assert((pos + frame_size) <= stop);
      if ((pos + frame_size) > stop)
        return E_FILE_FORMAT_INVALID;

      Frame& f = *pf++;

      f.pos = pos;
      f.len = static_cast<long>(frame_size);

      pos += frame_size;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else {
    assert(lacing == 3);  // EBML lacing

    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    long long size = 0;
    int frame_count = m_frame_count;

    long long frame_size = ReadUInt(pReader, pos, len);

    if (frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

#if LLONG_MAX > LONG_MAX
    if (frame_size > LONG_MAX)
      return E_FILE_FORMAT_INVALID;
#endif

    if ((pos + len) > stop)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume length of size of first frame

    if ((pos + frame_size) > stop)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    {
      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      curr.len = static_cast<long>(frame_size);
      size += curr.len;  // contribution of this frame
    }

    --frame_count;

    while (frame_count > 1) {
      if (pos >= stop)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      const long long delta_size_ = ReadUInt(pReader, pos, len);

      if (delta_size_ < 0)
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > stop)
        return E_FILE_FORMAT_INVALID;

      pos += len;  // consume length of (delta) size
      if (pos > stop)
        return E_FILE_FORMAT_INVALID;

      const long exp = 7 * len - 1;
      const long long bias = (1LL << exp) - 1LL;
      const long long delta_size = delta_size_ - bias;

      frame_size += delta_size;

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

#if LLONG_MAX > LONG_MAX
      if (frame_size > LONG_MAX)
        return E_FILE_FORMAT_INVALID;
#endif

      curr.len = static_cast<long>(frame_size);
      // Check if size + curr.len could overflow.
      if (size > LLONG_MAX - curr.len) {
        return E_FILE_FORMAT_INVALID;
      }
      size += curr.len;  // contribution of this frame

      --frame_count;
    }

    // parse last frame
    if (frame_count > 0) {
      if (pos > stop || pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf++;
      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      curr.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      curr.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    if (pos != stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;  // success
}